

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcapng.c
# Opt level: O1

PCAPNG_RESULT
pcapng_create(PCAPNG_HANDLE *handle,char *filename,option_header *section_options,
             size_t section_options_space,uint16_t link_type,uint32_t snaplen,
             option_header *interface_options,size_t interface_options_space)

{
  ushort uVar1;
  int iVar2;
  size_t sVar3;
  option_header *poVar4;
  int iVar5;
  int __fd;
  section_header_block *psVar6;
  int *piVar7;
  interface_description_block *piVar8;
  uint32_t uVar9;
  long lVar10;
  PCAPNG_RESULT PVar11;
  ssize_t sVar12;
  ssize_t sVar13;
  undefined8 uVar14;
  ulong uVar15;
  size_t sVar16;
  undefined8 local_68;
  interface_description_block idb;
  
  iVar5 = getpagesize();
  handle->section_header = (section_header_block *)0x0;
  handle->section_header_size = 0;
  handle->next_section_option_offset = 0;
  handle->interface_description = (interface_description_block *)0x0;
  handle->interface_description_size = 0;
  handle->next_interface_option_offset = 0;
  uVar14._0_2_ = 0;
  uVar14._2_2_ = 0;
  uVar14._4_4_ = 0;
  __fd = open(filename,0xc2,0x1b0);
  handle->fd = __fd;
  if (__fd != -1) goto LAB_00107ee3;
  piVar7 = __errno_location();
  iVar2 = *piVar7;
  if (iVar2 < 0x17) {
    if (iVar2 != 0xc) {
      uVar14._0_2_ = 3;
      uVar14._2_2_ = 0;
      uVar14._4_4_ = 0;
      if (iVar2 == 0x11) goto LAB_00107ee3;
LAB_0010832b:
      uVar14._0_2_ = 2;
      uVar14._2_2_ = 0;
      uVar14._4_4_ = 0;
      goto LAB_00107ee3;
    }
  }
  else {
    if (iVar2 - 0x17U < 2) {
      uVar14._0_2_ = 4;
      uVar14._2_2_ = 0;
      uVar14._4_4_ = 0;
      goto LAB_00107ee3;
    }
    if (iVar2 != 0x1c) goto LAB_0010832b;
  }
  uVar14._0_2_ = 5;
  uVar14._2_2_ = 0;
  uVar14._4_4_ = 0;
LAB_00107ee3:
  sVar13 = -1;
  sVar12 = -1;
  idb._8_8_ = uVar14;
  if (__fd != -1) {
    handle->section_header_size = 0x18;
    sVar12 = write(__fd,&DAT_0010c520,0x18);
    if ((section_options != (option_header *)0x0 && sVar12 != -1) &&
       (section_options->option_code != 0)) {
      while( true ) {
        uVar1 = section_options->option_length;
        if (uVar1 == 0) break;
        uVar15 = (ulong)(uVar1 + 3 & 0xfffffffc);
        sVar12 = write(handle->fd,section_options,(ulong)uVar1 + 4);
        if (sVar12 != -1 && uVar15 != uVar1) {
          lVar10 = uVar1 - uVar15;
          do {
            lVar10 = lVar10 + 1;
            sVar12 = write(handle->fd,"",1);
            if (lVar10 == 0) break;
          } while (sVar12 != -1);
        }
        handle->section_header_size = handle->section_header_size + uVar15 + 4;
        if ((sVar12 == -1) ||
           (poVar4 = section_options + 1,
           section_options = (option_header *)((long)&section_options[1].option_code + uVar15),
           *(short *)((long)&poVar4->option_code + uVar15) == 0)) break;
      }
    }
    handle->next_section_option_offset = handle->section_header_size;
  }
  if (sVar12 == -1) {
    PVar11 = PCAPNG_FILE_WRITE_ERROR;
  }
  else {
    sVar3 = handle->section_header_size;
    uVar15 = sVar3 + section_options_space + (long)iVar5 + 3;
    sVar16 = uVar15 - uVar15 % (ulong)(long)iVar5;
    handle->section_header_size = sVar16;
    lVar10 = sVar16 - sVar3;
    if (lVar10 != 0) {
      do {
        sVar12 = write(handle->fd,"",1);
        lVar10 = lVar10 + -1;
        if (lVar10 == 0) break;
      } while (sVar12 != -1);
    }
    psVar6 = (section_header_block *)mmap((void *)0x0,handle->section_header_size,3,1,handle->fd,0);
    handle->section_header = psVar6;
    PVar11 = idb._8_4_;
    sVar13 = sVar12;
  }
  if (PVar11 == PCAPNG_OK) {
    if (sVar13 == -1) {
      PVar11 = PCAPNG_FILE_WRITE_ERROR;
      sVar13 = -1;
    }
    else if (handle->section_header == (section_header_block *)0xffffffffffffffff) {
      PVar11 = PCAPNG_MMAP_FAILED;
    }
    else {
      local_68 = 1;
      idb.block_type._2_2_ = 0;
      handle->interface_description_size = 0x10;
      idb.block_type._0_2_ = link_type;
      idb.block_total_length = snaplen;
      sVar13 = write(handle->fd,&local_68,0x10);
      if ((interface_options != (option_header *)0x0 && sVar13 != -1) &&
         (interface_options->option_code != 0)) {
        while( true ) {
          uVar1 = interface_options->option_length;
          if (uVar1 == 0) break;
          uVar15 = (ulong)(uVar1 + 3 & 0xfffffffc);
          sVar13 = write(handle->fd,interface_options,(ulong)uVar1 + 4);
          if (sVar13 != -1 && uVar15 != uVar1) {
            lVar10 = uVar1 - uVar15;
            do {
              lVar10 = lVar10 + 1;
              sVar13 = write(handle->fd,"",1);
              if (lVar10 == 0) break;
            } while (sVar13 != -1);
          }
          handle->interface_description_size = handle->interface_description_size + uVar15 + 4;
          if ((sVar13 == -1) ||
             (poVar4 = interface_options + 1,
             interface_options = (option_header *)((long)&interface_options[1].option_code + uVar15)
             , *(short *)((long)&poVar4->option_code + uVar15) == 0)) break;
        }
      }
      handle->next_interface_option_offset = handle->interface_description_size;
      PVar11 = PCAPNG_OK;
    }
  }
  if (PVar11 == PCAPNG_OK) {
    if (sVar13 == -1) {
      PVar11 = PCAPNG_FILE_WRITE_ERROR;
      sVar13 = -1;
    }
    else {
      sVar3 = handle->interface_description_size;
      uVar15 = sVar3 + interface_options_space + (long)iVar5 + 3;
      PVar11 = PCAPNG_OK;
      sVar16 = uVar15 - uVar15 % (ulong)(long)iVar5;
      handle->interface_description_size = sVar16;
      lVar10 = sVar16 - sVar3;
      if (lVar10 != 0) {
        do {
          sVar13 = write(handle->fd,"",1);
          lVar10 = lVar10 + -1;
          if (lVar10 == 0) break;
        } while (sVar13 != -1);
      }
      piVar8 = (interface_description_block *)
               mmap((void *)0x0,handle->interface_description_size,3,1,handle->fd,
                    handle->section_header_size);
      handle->interface_description = piVar8;
    }
  }
  if (PVar11 == PCAPNG_OK) {
    if (sVar13 == -1) {
      PVar11 = PCAPNG_FILE_WRITE_ERROR;
    }
    else if (handle->interface_description == (interface_description_block *)0xffffffffffffffff) {
      PVar11 = PCAPNG_MMAP_FAILED;
    }
    else {
      padopt.option_length =
           ((short)(int)handle->section_header_size - (short)handle->next_section_option_offset) -
           0xc;
      *(option_header *)
       ((long)&handle->section_header->block_type + handle->next_section_option_offset) = padopt;
      psVar6 = handle->section_header;
      uVar15 = handle->section_header_size;
      uVar9 = (uint32_t)uVar15;
      psVar6->block_total_length = uVar9;
      *(uint32_t *)((long)psVar6 + ((uVar15 & 0xfffffffffffffffc) - 4)) = uVar9;
      padopt.option_length =
           ((short)(int)handle->interface_description_size -
           (short)handle->next_interface_option_offset) - 0xc;
      *(option_header *)
       ((long)&handle->interface_description->block_type + handle->next_interface_option_offset) =
           padopt;
      piVar8 = handle->interface_description;
      uVar15 = handle->interface_description_size;
      piVar8->block_total_length = (uint32_t)uVar15;
      *(uint32_t *)((long)piVar8 + ((uVar15 & 0xfffffffffffffffc) - 4)) = (uint32_t)uVar15;
      handle->section_header->section_length = uVar15;
      PVar11 = PCAPNG_OK;
    }
  }
  if (PVar11 != PCAPNG_OK) {
    pcapng_close(handle);
  }
  return PVar11;
}

Assistant:

PCAPNG_RESULT pcapng_create( PCAPNG_HANDLE * handle,
			     const char * filename,
			     const option_header * section_options,
			     const size_t section_options_space,
			     const uint16_t link_type,
			     const uint32_t snaplen,
			     const option_header * interface_options,
			     const size_t interface_options_space )
{
	PCAPNG_RESULT retval = PCAPNG_OK;
	int PGSZ = getpagesize( );
	size_t zeroes = 0, result = -1;

	handle->section_header = NULL;
	handle->interface_description = NULL;
	handle->section_header_size = handle->next_section_option_offset =
		handle->interface_description_size =
		handle->next_interface_option_offset = 0;

	handle->fd = open( filename, O_RDWR|O_CREAT|O_EXCL, S_IRUSR|S_IWUSR|S_IRGRP|S_IWGRP );
	if (handle->fd == -1) {
		switch( errno ) {
		case EEXIST:
			retval = PCAPNG_FILE_EXISTS;
			break;
		case EMFILE:
		case ENFILE:
			retval = PCAPNG_TOO_MANY_FILES_OPEN;
			break;
		case ENOMEM:
		case ENOSPC:
			retval = PCAPNG_NO_MEMORY;
			break;
		default:
			retval = PCAPNG_FILE_NOT_ALLOWED;
		}
	}

	if (retval == PCAPNG_OK) {
		/* section header */
		const section_header_block shb = {
			.block_type = BLOCK_TYPE_SECTION_HEADER,
			.block_total_length = 28,
			.byte_order_magic = SECTION_HEADER_BYTE_ORDER_MAGIC,
			.major_version = 1,
			.minor_version = 0,
			.section_length = (uint64_t) -1,
		};
		handle->section_header_size = sizeof( shb );
		result = write( handle->fd, &shb, sizeof( shb ) );
		/* write initial section options */
		while ((result != -1) &&
		       section_options &&
		       section_options->option_code &&
		       section_options->option_length) {
			size_t paddedsz = 4*((section_options->option_length+3)/4);
			zeroes = paddedsz - section_options->option_length;
			result = write( handle->fd, section_options, 4+section_options->option_length );
			while ((zeroes > 0) && (result != -1)) {
				result = write( handle->fd, "\0", 1 );
				zeroes--;
			}
			section_options = (const option_header *) &((uint8_t *)section_options)[4+paddedsz];
			handle->section_header_size += (4+paddedsz);
		}
		handle->next_section_option_offset = handle->section_header_size;
	}

	if (result == -1) {
		retval = PCAPNG_FILE_WRITE_ERROR;
	}
	else {
		/* determine the size of section header with desired space */
		zeroes = (size_t) PGSZ*((handle->section_header_size + 4 +
					 section_options_space + PGSZ - 1)/PGSZ) -
			handle->section_header_size;
		handle->section_header_size += zeroes;
		while ((zeroes > 0) && (result != -1)) {
			result = write( handle->fd, "\0", 1 );
			zeroes--;
		}

		/* mmap the section header */
		handle->section_header = mmap( NULL, handle->section_header_size, 
					       PROT_READ|PROT_WRITE,
					       MAP_SHARED,
					       handle->fd, 0 );
	}

	if (retval == PCAPNG_OK) {
		if (result == -1) {
			retval = PCAPNG_FILE_WRITE_ERROR;
		}
		else if (handle->section_header == MAP_FAILED) {
			retval = PCAPNG_MMAP_FAILED;
		}
		else {
			/* write the interface header */
			const interface_description_block idb = {
				.block_type = BLOCK_TYPE_INTERFACE,
				.block_total_length = 0,
				.link_type = link_type,
				.snaplen = snaplen
			};
			handle->interface_description_size = sizeof( idb );
			result = write( handle->fd, &idb, sizeof( idb ) );

			/* write interface options */
			while ((result != -1) &&
			       interface_options &&
			       interface_options->option_code &&
			       interface_options->option_length) {
				size_t paddedsz = 4*((interface_options->option_length+3)/4);
				zeroes = paddedsz - interface_options->option_length;
				result = write( handle->fd, interface_options, 4+interface_options->option_length );
				while ((zeroes > 0) && (result != -1)) {
					result = write( handle->fd, "\0", 1 );
					zeroes--;
				}
				interface_options = (const option_header *) &((uint8_t *)interface_options)[4+paddedsz];
				handle->interface_description_size += (4+paddedsz);
			}
			handle->next_interface_option_offset = handle->interface_description_size;
		}
	}

	if (retval == PCAPNG_OK) {
		if (result == -1) {
			retval = PCAPNG_FILE_WRITE_ERROR;
		}
		else {
			/* determine the size of interface description with desired space */
			zeroes = (size_t) PGSZ*((handle->interface_description_size + 4 +
						 interface_options_space + PGSZ - 1)/PGSZ) -
				handle->interface_description_size;
			handle->interface_description_size += zeroes;
			while ((zeroes > 0) && (result != -1)) {
				result = write( handle->fd, "\0", 1 );
				zeroes--;
			}

			/* mmap the interface description */
			handle->interface_description = mmap( NULL, handle->interface_description_size, 
							      PROT_READ|PROT_WRITE,
							      MAP_SHARED,
							      handle->fd,
							      handle->section_header_size );
		}
	}

	if (retval == PCAPNG_OK) {
		if (result == -1) {
			retval = PCAPNG_FILE_WRITE_ERROR;
		}
		else if (handle->interface_description == MAP_FAILED) {
			retval = PCAPNG_MMAP_FAILED;
		}
		else {
			uint8_t * dest = &((uint8_t *)handle->section_header)[handle->next_section_option_offset];
			padopt.option_length = handle->section_header_size -
				handle->next_section_option_offset - 12;

			/* Add padding options, update the header sizes. */
			(void) memcpy( dest, &padopt, sizeof( padopt ) );
			handle->section_header->block_total_length =
				(uint32_t) handle->section_header_size;
			((uint32_t*)handle->section_header)[handle->section_header_size/4-1] =
				(uint32_t) handle->section_header_size;

			padopt.option_length = handle->interface_description_size -
				handle->next_interface_option_offset - 12;
			dest = &((uint8_t *)handle->interface_description)[handle->next_interface_option_offset];
			(void) memcpy( dest, &padopt, sizeof( padopt ) );
			handle->interface_description->block_total_length =
				(uint32_t) handle->interface_description_size;
			((uint32_t*)handle->interface_description)[handle->interface_description_size/4-1] =
				(uint32_t) handle->interface_description_size;

			handle->section_header->section_length = (uint64_t) handle->interface_description_size;
		}
	}

	if (retval != PCAPNG_OK) {
		(void) pcapng_close( handle );
	}

	return retval;
}